

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

Section * dummy_section(GlobalVars *gv,ObjectUnit *ou)

{
  LinkedSection *pLVar1;
  undefined8 in_RSI;
  undefined2 uVar2;
  unsigned_long in_RDI;
  uint8_t *unaff_retaddr;
  char *in_stack_00000008;
  ObjectUnit *in_stack_00000010;
  LinkedSection *ls;
  Section *s;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Section *local_18;
  
  uVar2 = (undefined2)((ulong)in_RSI >> 0x30);
  local_18 = *(Section **)(in_RDI + 0x208);
  if (local_18 == (Section *)0x0) {
    pLVar1 = (LinkedSection *)
             alloczero(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_18 = add_section(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,
                           (uint8_t)((ushort)uVar2 >> 8),(uint8_t)uVar2,(uint8_t)s,(uint8_t)ou,
                           (bool)gv);
    local_18->lnksec = pLVar1;
    pLVar1->name = local_18->name;
    pLVar1->type = local_18->type;
    pLVar1->flags = local_18->flags;
    pLVar1->protection = local_18->protection;
    pLVar1->index = -1;
    initlist(&pLVar1->sections);
    initlist(&pLVar1->relocs);
    initlist(&pLVar1->xrefs);
    initlist(&pLVar1->symbols);
    *(Section **)(in_RDI + 0x208) = local_18;
  }
  return local_18;
}

Assistant:

struct Section *dummy_section(struct GlobalVars *gv,struct ObjectUnit *ou)
/* Make a dummy section already attached to a dummy-LinkedSection, which
   won't appear in any section lists.
   Can be used for relocatable linker symbols, which need a specific value. */
{
  struct Section *s;

  if (!(s = gv->dummysec)) {
    struct LinkedSection *ls = alloczero(sizeof(struct LinkedSection));

    s = add_section(ou,"*linker*",NULL,0,ST_TMP,
                    SF_ALLOC|SF_UNINITIALIZED,SP_READ|SP_WRITE,0,TRUE);
    s->lnksec = ls;
    ls->name = s->name;
    ls->type = s->type;
    ls->flags = s->flags;
    ls->protection = s->protection;
    ls->index = INVALID;
    initlist(&ls->sections);
    initlist(&ls->relocs);
    initlist(&ls->xrefs);
    initlist(&ls->symbols);
    gv->dummysec = s;
  }
  return s;
}